

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xreq.c
# Opt level: O0

int nn_xreq_add(nn_sockbase *self,nn_pipe *pipe)

{
  nn_xreq_data *local_40;
  size_t local_38;
  size_t sz;
  int rcvprio;
  int sndprio;
  nn_xreq_data *data;
  nn_xreq *xreq;
  nn_pipe *pipe_local;
  nn_sockbase *self_local;
  
  local_40 = (nn_xreq_data *)self;
  if (self == (nn_sockbase *)0x0) {
    local_40 = (nn_xreq_data *)0x0;
  }
  data = local_40;
  local_38 = 4;
  xreq = (nn_xreq *)pipe;
  pipe_local = (nn_pipe *)self;
  nn_pipe_getopt(pipe,0,8,(void *)((long)&sz + 4),&local_38);
  if (local_38 != 4) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (sndprio)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/reqrep/xreq.c"
            ,0x5e);
    fflush(_stderr);
    nn_err_abort();
  }
  if (sz._4_4_ < 1 || 0x10 < sz._4_4_) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sndprio >= 1 && sndprio <= 16",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/reqrep/xreq.c"
            ,0x5f);
    fflush(_stderr);
    nn_err_abort();
  }
  local_38 = 4;
  nn_pipe_getopt((nn_pipe *)xreq,0,9,&sz,&local_38);
  if (local_38 == 4) {
    if ((int)sz < 1 || 0x10 < (int)sz) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rcvprio >= 1 && rcvprio <= 16",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/reqrep/xreq.c"
              ,100);
      fflush(_stderr);
      nn_err_abort();
    }
    _rcvprio = (nn_lb_data *)nn_alloc_(0x40);
    if (_rcvprio == (nn_lb_data *)0x0) {
      fprintf(_stderr,"Out of memory (%s:%d)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/reqrep/xreq.c"
              ,0x67);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_pipe_setdata((nn_pipe *)xreq,_rcvprio);
    nn_lb_add((nn_lb *)&(data->lb).priodata.item,_rcvprio,(nn_pipe *)xreq,sz._4_4_);
    nn_fq_add((nn_fq *)&data[6].lb.priodata.item.prev,(nn_fq_data *)(_rcvprio + 1),(nn_pipe *)xreq,
              (int)sz);
    return 0;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (rcvprio)",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/reqrep/xreq.c"
          ,99);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int nn_xreq_add (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xreq *xreq;
    struct nn_xreq_data *data;
    int sndprio;
    int rcvprio;
    size_t sz;

    xreq = nn_cont (self, struct nn_xreq, sockbase);

    sz = sizeof (sndprio);
    nn_pipe_getopt (pipe, NN_SOL_SOCKET, NN_SNDPRIO, &sndprio, &sz);
    nn_assert (sz == sizeof (sndprio));
    nn_assert (sndprio >= 1 && sndprio <= 16);

    sz = sizeof (rcvprio);
    nn_pipe_getopt (pipe, NN_SOL_SOCKET, NN_RCVPRIO, &rcvprio, &sz);
    nn_assert (sz == sizeof (rcvprio));
    nn_assert (rcvprio >= 1 && rcvprio <= 16);

    data = nn_alloc (sizeof (struct nn_xreq_data), "pipe data (req)");
    alloc_assert (data);
    nn_pipe_setdata (pipe, data);
    nn_lb_add (&xreq->lb, &data->lb, pipe, sndprio);
    nn_fq_add (&xreq->fq, &data->fq, pipe, rcvprio);

    return 0;
}